

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,FRegList l)

{
  uint uVar1;
  char *pcVar2;
  int i_1;
  int i;
  long lVar3;
  Fp fp;
  bool bVar4;
  int r [8];
  undefined8 uStack_50;
  uint local_48 [10];
  
  lVar3 = 0;
  do {
    local_48[lVar3] = (uint)((l.raw >> ((uint)lVar3 & 0x1f) & 1) != 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  lVar3 = 1;
  do {
    if (local_48[lVar3] != 0) {
      local_48[lVar3] = *(int *)((long)&uStack_50 + lVar3 * 4 + 4) + 1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  lVar3 = 6;
  do {
    if ((local_48[lVar3] != 0) && (local_48[lVar3 + 1] != 0)) {
      local_48[lVar3] = local_48[lVar3 + 1];
    }
    bVar4 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar4);
  bVar4 = true;
  fp.raw = 0;
  do {
    uVar1 = local_48[fp.raw];
    if (uVar1 != 0) {
      if (bVar4) {
        bVar4 = false;
      }
      else {
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = '/';
      }
      uStack_50 = 0x130feb;
      operator<<(this,fp);
      if (uVar1 != 1) {
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = '-';
        uStack_50 = 0x13100e;
        operator<<(this,(Fp)(fp.raw + uVar1 + -1));
      }
    }
    fp.raw = fp.raw + uVar1 + 1;
  } while (fp.raw < 8);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(FRegList l)
{
    int r[8];

    // Step 1: Fill array r with the register list bits, e.g., 11101101
    for (int i = 0; i <= 7; i++) { r[i] = !!(l.raw & (1 << i)); }

    // Step 2: Convert 11101101 to 12301201
    for (int i = 1; i <= 7; i++) { if (r[i]) r[i] = r[i-1] + 1; }

    // Step 3: Convert 12301201 to 33302201
    for (int i = 6; i >= 0; i--) { if (r[i] && r[i+1]) r[i] = r[i+1]; }

    // Step 4: Convert 33302201 to "FP0-FP2/FP4/FP5/FP7"
    bool first = true;
    for (int i = 0; i <= 7; i += r[i] + 1) {

        if (r[i] == 0) continue;

        // Print delimiter
        if (first) { first = false; } else { *this << "/"; }

        // Format variant 1: Single register
        if (r[i] == 1) { *this << Fp{i}; }

        // Format variant 2: Register range
        else { *this << Fp{i} << "-" << Fp{i+r[i]-1}; }
    }

    return *this;
}